

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O2

void __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::~MeshTraversalSequencer
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this)

{
  ~MeshTraversalSequencer(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

MeshTraversalSequencer(const Mesh *mesh,
                         const MeshAttributeIndicesEncodingData *encoding_data)
      : mesh_(mesh), encoding_data_(encoding_data), corner_order_(nullptr) {}